

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

void * utf8pbrk(void *str,void *accept)

{
  size_t offset;
  char *a;
  char *s;
  void *accept_local;
  void *str_local;
  
  s = (char *)str;
  do {
    if (*s == '\0') {
      return (void *)0x0;
    }
    offset = 0;
    a = (char *)accept;
    while (*a != '\0') {
      if ((((int)*a & 0xc0U) != 0x80) && (offset != 0)) {
        return s;
      }
      if (*a == s[offset]) {
        offset = offset + 1;
        a = a + 1;
      }
      else {
        do {
          a = a + 1;
        } while (((int)*a & 0xc0U) == 0x80);
        offset = 0;
      }
    }
    if (offset != 0) {
      return s;
    }
    do {
      s = s + 1;
    } while (((int)*s & 0xc0U) == 0x80);
  } while( true );
}

Assistant:

void *utf8pbrk(const void *str, const void *accept) {
  const char *s = (const char *)str;

  while ('\0' != *s) {
    const char *a = (const char *)accept;
    size_t offset = 0;

    while ('\0' != *a) {
      // checking that if *a is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *a)) && (0 < offset)) {
        return (void *)s;
      } else {
        if (*a == s[offset]) {
          // part of a utf8 codepoint matched, so move our checking
          // onwards to the next byte
          offset++;
          a++;
        } else {
          // r could be in the middle of an unmatching utf8 code point,
          // so we need to march it on to the next character beginning,

          do {
            a++;
          } while (0x80 == (0xc0 & *a));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // we found a match on the last utf8 codepoint
    if (0 < offset) {
      return (void *)s;
    }

    // the current utf8 codepoint in src did not match accept, but src
    // could have been partway through a utf8 codepoint, so we need to
    // march it onto the next utf8 codepoint starting byte
    do {
      s++;
    } while ((0x80 == (0xc0 & *s)));
  }

  return 0;
}